

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O1

void __thiscall
cppcms::url_dispatcher::assign<disp>
          (url_dispatcher *this,string *regex,offset_in_disp_to_subr member,disp *object)

{
  offset_in_disp_to_subr in_R8;
  offset_in_disp_to_subr *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (offset_in_disp_to_subr *)0x0;
  uStack_50 = 0;
  local_58 = (offset_in_disp_to_subr *)operator_new(0x18);
  *local_58 = member;
  local_58[1] = (offset_in_disp_to_subr)object;
  local_58[2] = in_R8;
  pcStack_40 = std::_Function_handler<void_(),_cppcms::url_dispatcher::binder0<disp>_>::_M_invoke;
  local_48 = std::_Function_handler<void_(),_cppcms::url_dispatcher::binder0<disp>_>::_M_manager;
  cppcms::url_dispatcher::assign(this,regex,&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(),C *object)
		{
			assign(regex,binder0<C>(member,object));
		}